

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_eval.h
# Opt level: O0

Violation mp::ComputeViolation<mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
                    (QuadraticConeConstraint *con,
                    VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *x)

{
  Violation VVar1;
  Arguments *this;
  Parameters *this_00;
  const_reference pvVar2;
  long in_RDI;
  double dVar3;
  double dVar4;
  double dVar5;
  size_type i;
  double sum;
  Parameters *params;
  Arguments *args;
  int in_stack_ffffffffffffff8c;
  VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *in_stack_ffffffffffffff90;
  VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *this_01;
  undefined8 local_40;
  undefined8 local_38;
  
  this = CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::QuadraticConeId>
         ::GetArguments((CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::QuadraticConeId>
                         *)(in_RDI + 0x20));
  this_00 = CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::QuadraticConeId>
            ::GetParameters((CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::QuadraticConeId>
                             *)(in_RDI + 0x20));
  local_38 = 0.0;
  local_40 = std::vector<int,_std::allocator<int>_>::size(this);
  while (local_40 = local_40 - 1, local_40 != 0) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](this_00,local_40);
    dVar4 = *pvVar2;
    std::vector<int,_std::allocator<int>_>::operator[](this,local_40);
    dVar3 = VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::operator[]
                      (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    dVar4 = pow(dVar4 * dVar3,2.0);
    local_38 = dVar4 + local_38;
  }
  dVar3 = sqrt(local_38);
  this_01 = (VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *)0x0;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](this_00,0);
  dVar4 = *pvVar2;
  std::vector<int,_std::allocator<int>_>::operator[](this,(size_type)this_01);
  dVar5 = VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::operator[]
                    (this_01,in_stack_ffffffffffffff8c);
  VVar1.valX_ = local_38;
  VVar1.viol_ = dVar3 - dVar4 * dVar5;
  return VVar1;
}

Assistant:

Violation ComputeViolation(
    const QuadraticConeConstraint& con, const VarVec& x) {
  const auto& args = con.GetArguments();
  const auto& params = con.GetParameters();
  assert(args.size()==params.size());
  double sum = 0.0;
  for (auto i=args.size(); --i; )
    sum += std::pow( params[i]*x[args[i]], 2.0 );
  return {std::sqrt(sum) - params[0]*x[args[0]],
        sum};
}